

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O0

void ngram_fwdflat_init(ngram_search_t *ngs)

{
  int iVar1;
  int32 *piVar2;
  bitvec_t *pbVar3;
  ps_latnode_t **pppVar4;
  long lVar5;
  int n_words;
  ngram_search_t *ngs_local;
  
  iVar1 = (ngs->base).n_words;
  piVar2 = (int32 *)__ckd_calloc__((long)(iVar1 + 1),4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                   ,0x93);
  ngs->fwdflat_wordlist = piVar2;
  pbVar3 = (bitvec_t *)
           __ckd_calloc__((long)((iVar1 + 0x1f) / 0x20),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x94);
  ngs->expand_word_flag = pbVar3;
  piVar2 = (int32 *)__ckd_calloc__((long)(iVar1 + 1),4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                   ,0x95);
  ngs->expand_word_list = piVar2;
  pppVar4 = (ps_latnode_t **)
            __ckd_calloc__((long)ngs->n_frame_alloc,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                           ,0x96);
  ngs->frm_wordlist = pppVar4;
  lVar5 = ps_config_int((ngs->base).config,"fwdflatefwid");
  ngs->min_ef_width = (int32)lVar5;
  lVar5 = ps_config_int((ngs->base).config,"fwdflatsfwin");
  ngs->max_sf_win = (int32)lVar5;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x9a,"fwdflat: min_ef_width = %d, max_sf_win = %d\n",(ulong)(uint)ngs->min_ef_width,
          (ulong)(uint)ngs->max_sf_win);
  if (ngs->fwdtree == '\0') {
    ngram_fwdflat_expand_all(ngs);
    ngram_fwdflat_allocate_1ph(ngs);
  }
  return;
}

Assistant:

void
ngram_fwdflat_init(ngram_search_t *ngs)
{
    int n_words;

    n_words = ps_search_n_words(ngs);
    ngs->fwdflat_wordlist = ckd_calloc(n_words + 1, sizeof(*ngs->fwdflat_wordlist));
    ngs->expand_word_flag = bitvec_alloc(n_words);
    ngs->expand_word_list = ckd_calloc(n_words + 1, sizeof(*ngs->expand_word_list));
    ngs->frm_wordlist = ckd_calloc(ngs->n_frame_alloc, sizeof(*ngs->frm_wordlist));
    ngs->min_ef_width = ps_config_int(ps_search_config(ngs), "fwdflatefwid");
    ngs->max_sf_win = ps_config_int(ps_search_config(ngs), "fwdflatsfwin");
    E_INFO("fwdflat: min_ef_width = %d, max_sf_win = %d\n",
           ngs->min_ef_width, ngs->max_sf_win);

    /* No tree-search; pre-build the expansion list, including all LM words. */
    if (!ngs->fwdtree) {
        /* Build full expansion list from LM words. */
        ngram_fwdflat_expand_all(ngs);
        /* Allocate single phone words. */
        ngram_fwdflat_allocate_1ph(ngs);
    }
}